

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

void __thiscall hmac_hash::SHA256::transform(SHA256 *this,uint8_t *message,size_t block_nb)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong local_168;
  size_t j;
  size_t i;
  uint8_t *sub_block;
  uint32_t t2;
  uint32_t t1;
  uint32_t wv [8];
  uint32_t w [64];
  size_t block_nb_local;
  uint8_t *message_local;
  SHA256 *this_local;
  
  for (j = 0; j < block_nb; j = j + 1) {
    for (local_168 = 0; local_168 < 0x10; local_168 = local_168 + 1) {
      wv[local_168 + 6] =
           CONCAT13(message[local_168 * 4 + j * 0x40],
                    CONCAT12(message[local_168 * 4 + j * 0x40 + 1],
                             CONCAT11(message[local_168 * 4 + j * 0x40 + 2],
                                      message[local_168 * 4 + j * 0x40 + 3])));
    }
    for (local_168 = 0x10; local_168 < 0x40; local_168 = local_168 + 1) {
      wv[local_168 + 6] =
           ((wv[local_168 + 4] >> 0x11 | wv[local_168 + 4] << 0xf) ^
            (wv[local_168 + 4] >> 0x13 | wv[local_168 + 4] << 0xd) ^ wv[local_168 + 4] >> 10) +
           wv[local_168 - 1] +
           ((wv[local_168 - 9] >> 7 | wv[local_168 - 9] << 0x19) ^
            (wv[local_168 - 9] >> 0x12 | wv[local_168 - 9] << 0xe) ^ wv[local_168 - 9] >> 3) +
           wv[local_168 - 10];
    }
    for (local_168 = 0; local_168 < 8; local_168 = local_168 + 1) {
      (&t2)[local_168] = this->m_h[local_168];
    }
    for (local_168 = 0; local_168 < 0x40; local_168 = local_168 + 1) {
      iVar1 = wv[5] + ((wv[2] >> 6 | wv[2] << 0x1a) ^ (wv[2] >> 0xb | wv[2] << 0x15) ^
                      (wv[2] >> 0x19 | wv[2] << 7)) + (wv[2] & wv[3] ^ (wv[2] ^ 0xffffffff) & wv[4])
              + *(int *)(sha256_k + local_168 * 4) + wv[local_168 + 6];
      uVar2 = t2 & t1;
      uVar3 = t2 & wv[0];
      uVar4 = t1 & wv[0];
      wv[5] = wv[4];
      wv[4] = wv[3];
      wv[3] = wv[2];
      wv[2] = wv[1] + iVar1;
      wv[1] = wv[0];
      wv[0] = t1;
      t1 = t2;
      t2 = iVar1 + ((t2 >> 2 | t2 << 0x1e) ^ (t2 >> 0xd | t2 << 0x13) ^ (t2 >> 0x16 | t2 << 10)) +
                   (uVar2 ^ uVar3 ^ uVar4);
    }
    for (local_168 = 0; local_168 < 8; local_168 = local_168 + 1) {
      this->m_h[local_168] = (&t2)[local_168] + this->m_h[local_168];
    }
  }
  return;
}

Assistant:

void SHA256::transform(const uint8_t *message, size_t block_nb) {
        uint32_t w[64];
        uint32_t wv[8];
        uint32_t t1, t2;
        const uint8_t *sub_block;
        size_t i;
        size_t j;
        for(i = 0; i < block_nb; ++i) {
            sub_block = message + (i << 6);
            for(j = 0; j < 16; ++j) {
                SHA2_PACK32(&sub_block[j << 2], &w[j]);
            }
            for(j = 16; j < 64; ++j) {
                w[j] =  SHA256_F4(w[j -  2]) + w[j -  7] + SHA256_F3(w[j - 15]) + w[j - 16];
            }
            for(j = 0; j < 8; ++j) {
                wv[j] = m_h[j];
            }
            for(j = 0; j < 64; ++j) {
                t1 = wv[7] + SHA256_F2(wv[4]) + SHA2_CH(wv[4], wv[5], wv[6])
                    + sha256_k[j] + w[j];
                t2 = SHA256_F1(wv[0]) + SHA2_MAJ(wv[0], wv[1], wv[2]);
                wv[7] = wv[6];
                wv[6] = wv[5];
                wv[5] = wv[4];
                wv[4] = wv[3] + t1;
                wv[3] = wv[2];
                wv[2] = wv[1];
                wv[1] = wv[0];
                wv[0] = t1 + t2;
            }
            for(j = 0; j < 8; ++j) {
                m_h[j] += wv[j];
            }
        }
    }